

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

TValue * luaV_tonumber(TValue *obj,TValue *n)

{
  int iVar1;
  TValue *io;
  lua_Number num;
  Value local_10;
  
  if (obj->tt_ != 3) {
    if (((obj->tt_ & 0xfU) == 4) &&
       (iVar1 = luaO_str2d((char *)((obj->value_).f + 0x18),*(size_t *)((obj->value_).f + 0x10),
                           &local_10.n), iVar1 != 0)) {
      n->value_ = local_10;
      n->tt_ = 3;
      obj = n;
    }
    else {
      obj = (TValue *)0x0;
    }
  }
  return obj;
}

Assistant:

const TValue *luaV_tonumber (const TValue *obj, TValue *n) {
  lua_Number num;
  if (ttisnumber(obj)) return obj;
  if (ttisstring(obj) && luaO_str2d(svalue(obj), tsvalue(obj)->len, &num)) {
    setnvalue(n, num);
    return n;
  }
  else
    return NULL;
}